

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall wabt::Var::set_index(Var *this,Index index)

{
  long *plVar1;
  long *plVar2;
  
  if (this->type_ == Name) {
    plVar2 = (long *)(this->field_2).name_._M_dataplus._M_p;
    plVar1 = (long *)((long)&this->field_2 + 0x10);
    if (plVar2 != plVar1) {
      operator_delete(plVar2,*plVar1 + 1);
    }
  }
  this->type_ = Index;
  (this->field_2).index_ = index;
  return;
}

Assistant:

void Var::set_index(Index index) {
  Destroy();
  type_ = VarType::Index;
  index_ = index;
}